

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void ec_pubkey_parse_pointtest(uchar *input,int xvalid,int yvalid)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  undefined8 *extraout_RDX;
  uint uVar11;
  secp256k1_ge *ge_00;
  secp256k1_context *ctx;
  secp256k1_context *psVar12;
  byte bVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_result;
  size_t outl;
  unsigned_long _zzq_args [6];
  secp256k1_pubkey pubkey;
  uchar pubkeyc [65];
  secp256k1_ge ge;
  undefined8 local_1d8;
  secp256k1_ge *local_1d0;
  size_t local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  size_t local_1a8;
  int local_19c;
  undefined1 local_198 [104];
  ulong local_130;
  undefined1 local_128 [105];
  undefined8 uStack_bf;
  undefined8 local_b7;
  undefined8 uStack_af;
  secp256k1_ge local_98;
  
  local_198._80_8_ = 3;
  local_19c = xvalid;
  local_198._88_4_ = yvalid;
  local_198._96_8_ = input;
  do {
    bVar15 = local_19c != 0;
    local_128._65_8_ = *(undefined8 *)input;
    local_128._73_8_ = *(undefined8 *)(input + 8);
    local_128._81_8_ = *(undefined8 *)(input + 0x10);
    local_128._89_8_ = *(undefined8 *)(input + 0x18);
    local_128._97_8_ = *(undefined8 *)(input + 0x20);
    uStack_bf = *(undefined8 *)(input + 0x28);
    local_b7 = *(undefined8 *)(input + 0x30);
    uStack_af = *(undefined8 *)(input + 0x38);
    bVar16 = local_198._80_8_ == 0x21;
    local_198._92_4_ = (uint)(local_198._80_8_ == 0x41) * 4;
    local_130 = (ulong)(local_198._80_8_ == 0x41 || bVar16);
    uVar11 = 0;
    do {
      local_128[0x40] = (char)uVar11;
      uVar14 = input[0x3f] & 1 | 2;
      if ((local_19c == 0 || local_198._88_4_ == 0) || (uVar11 & 4) != local_198._92_4_) {
        bVar13 = 0;
      }
      else {
        bVar13 = ((uVar11 & 0xfb) == uVar14 || uVar11 == 4) & (byte)local_130;
      }
      psVar12 = CTX;
      if ((((bVar15 && bVar16) && (uVar11 & 0xfe) == 2) | bVar13) != 1) {
        local_128._48_8_ = 0xfefefefefefefefe;
        local_128._56_8_ = 0xfefefefefefefefe;
        local_128._32_8_ = 0xfefefefefefefefe;
        local_128._40_4_ = -0x1010102;
        local_128._44_4_ = -0x1010102;
        local_128._16_8_ = 0xfefefefefefefefe;
        local_128._24_8_ = 0xfefefefefefefefe;
        local_128._0_8_ = 0xfefefefefefefefe;
        local_128._8_8_ = 0xfefefefefefefefe;
        local_198._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430001;
        local_198._16_8_ = 0x40;
        local_198._24_8_ = 0;
        local_198._32_8_ = 0;
        local_198._40_4_ = 0;
        local_198._44_4_ = 0;
        local_1d8 = 0;
        ge_00 = (secp256k1_ge *)local_128;
        local_198._8_8_ = (secp256k1_ge *)local_128;
        iVar9 = secp256k1_ec_pubkey_parse
                          (CTX,(secp256k1_pubkey *)local_128,local_128 + 0x40,local_198._80_8_);
        ctx = CTX;
        if (iVar9 != 0) {
          ec_pubkey_parse_pointtest_cold_1();
          goto LAB_001581ab;
        }
        local_198._16_8_ = 0x40;
        local_198._24_8_ = 0;
        local_198._32_8_ = 0;
        local_198._40_4_ = 0;
        local_198._44_4_ = 0;
        local_1d8 = 0;
        local_198._0_8_ = (CTX->illegal_callback).fn;
        local_198._8_8_ = (CTX->illegal_callback).data;
        if (CTX == &secp256k1_context_static_) goto LAB_001581b0;
        (CTX->illegal_callback).fn = counting_callback_fn;
        (ctx->illegal_callback).data = &local_1d8;
        ge_00 = &local_98;
        iVar9 = secp256k1_pubkey_load(ctx,ge_00,(secp256k1_pubkey *)local_128);
        psVar12 = CTX;
        if (iVar9 != 0) goto LAB_001581bf;
        (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_198._0_8_;
        (psVar12->illegal_callback).data = (void *)local_198._8_8_;
        if ((int)local_1d8 == 1) goto LAB_00158179;
LAB_001581c4:
        ec_pubkey_parse_pointtest_cold_3();
LAB_001581c9:
        ec_pubkey_parse_pointtest_cold_13();
LAB_001581ce:
        ec_pubkey_parse_pointtest_cold_7();
LAB_001581d3:
        ec_pubkey_parse_pointtest_cold_12();
LAB_001581d8:
        ec_pubkey_parse_pointtest_cold_11();
LAB_001581dd:
        ec_pubkey_parse_pointtest_cold_8();
LAB_001581e2:
        ec_pubkey_parse_pointtest_cold_9();
LAB_001581e7:
        ec_pubkey_parse_pointtest_cold_6();
LAB_001581ec:
        ec_pubkey_parse_pointtest_cold_10();
        *(undefined1 *)&(ctx->ecmult_gen_ctx).built = 4;
        uVar3 = (ge_00->x).n[1];
        uVar4 = (ge_00->x).n[2];
        uVar5 = (ge_00->x).n[3];
        *(uint64_t *)((long)&(ctx->ecmult_gen_ctx).built + 1) = (ge_00->x).n[0];
        *(uint64_t *)((long)(ctx->ecmult_gen_ctx).scalar_offset.d + 1) = uVar3;
        *(uint64_t *)((long)(ctx->ecmult_gen_ctx).scalar_offset.d + 9) = uVar4;
        *(uint64_t *)((long)(ctx->ecmult_gen_ctx).scalar_offset.d + 0x11) = uVar5;
        uVar6 = extraout_RDX[1];
        uVar7 = extraout_RDX[2];
        uVar8 = extraout_RDX[3];
        *(undefined8 *)((long)(ctx->ecmult_gen_ctx).scalar_offset.d + 0x19) = *extraout_RDX;
        *(undefined8 *)((long)(ctx->ecmult_gen_ctx).ge_offset.x.n + 1) = uVar6;
        *(undefined8 *)((long)(ctx->ecmult_gen_ctx).ge_offset.x.n + 9) = uVar7;
        *(undefined8 *)((long)(ctx->ecmult_gen_ctx).ge_offset.x.n + 0x11) = uVar8;
        return;
      }
      local_128._0_8_ = 0;
      local_128._8_8_ = 0;
      local_128._16_8_ = 0;
      local_128._24_8_ = 0;
      local_128._32_8_ = 0;
      local_128._40_4_ = 0;
      local_128._44_4_ = 0;
      local_128._48_8_ = 0;
      local_128._56_8_ = 0;
      local_198._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430001;
      local_198._16_8_ = 0x40;
      local_198._24_8_ = 0;
      local_198._32_8_ = 0;
      local_198._40_4_ = 0;
      local_198._44_4_ = 0;
      local_1d8 = 0;
      ge_00 = (secp256k1_ge *)local_128;
      local_198._8_8_ = (secp256k1_ge *)local_128;
      iVar9 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)local_128,local_128 + 0x40,local_198._80_8_);
      if (iVar9 == 0) {
LAB_001581ab:
        ec_pubkey_parse_pointtest_cold_15();
        ctx = psVar12;
LAB_001581b0:
        ec_pubkey_parse_pointtest_cold_4();
LAB_001581b5:
        ec_pubkey_parse_pointtest_cold_14();
LAB_001581ba:
        ec_pubkey_parse_pointtest_cold_5();
LAB_001581bf:
        ec_pubkey_parse_pointtest_cold_2();
        goto LAB_001581c4;
      }
      local_198._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430005;
      local_198._16_8_ = 0x40;
      local_198._24_8_ = 0;
      local_198._32_8_ = 0;
      local_198._40_4_ = 0;
      local_198._44_4_ = 0;
      local_1a8 = 0x41;
      local_1d8 = 0x4d430001;
      local_1c8 = 0x41;
      local_1c0 = 0;
      local_1b8 = 0;
      local_1b0 = 0;
      ge_00 = (secp256k1_ge *)local_198;
      ctx = CTX;
      local_1d0 = (secp256k1_ge *)local_198;
      local_198._8_8_ = (secp256k1_ge *)local_128;
      iVar9 = secp256k1_ec_pubkey_serialize
                        (CTX,(uchar *)local_198,&local_1a8,(secp256k1_pubkey *)local_128,0x102);
      input = (uchar *)local_198._96_8_;
      if (iVar9 == 0) goto LAB_001581b5;
      local_1d8 = 0x4d430005;
      local_1c8 = local_1a8;
      local_1c0 = 0;
      local_1b8 = 0;
      local_1b0 = 0;
      uVar1 = (ulong)((long)ctx << 3) >> 0x33;
      uVar2 = (((long)ctx << 3 | (ulong)ctx >> 0x3d) << 0xd | uVar1) >> 3;
      ctx = (secp256k1_context *)(uVar2 << 0x33 | (uVar1 << 0x3d | uVar2) >> 0xd);
      local_1d0 = (secp256k1_ge *)local_198;
      if (local_1a8 != 0x21) goto LAB_001581ba;
      lVar10 = 1;
      do {
        if (local_198[lVar10] != local_128[lVar10 + 0x40]) goto LAB_001581e7;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x21);
      if ((local_198._80_8_ == 0x21) && (local_198[0] != local_128[0x40])) goto LAB_001581c9;
      if (bVar13 != 0) {
        if (local_198[0] != (char)uVar14) goto LAB_001581ce;
        ge_00 = &local_98;
        ctx = CTX;
        iVar9 = secp256k1_pubkey_load(CTX,&local_98,(secp256k1_pubkey *)local_128);
        if (iVar9 == 0) goto LAB_001581d3;
        local_128._48_8_ = 0;
        local_128._56_8_ = 0;
        local_128._32_8_ = 0;
        local_128._40_4_ = 0;
        local_128._44_4_ = 0;
        local_128._16_8_ = 0;
        local_128._24_8_ = 0;
        local_128._0_8_ = 0;
        local_128._8_8_ = 0;
        local_1d8 = 0x4d430001;
        local_1c8 = 0x40;
        local_1c0 = 0;
        local_1b8 = 0;
        local_1b0 = 0;
        local_1d0 = (secp256k1_ge *)local_128;
        secp256k1_ge_to_bytes((uchar *)local_128,&local_98);
        local_1a8 = 0x41;
        local_1d8 = 0x4d430001;
        local_1c8 = 0x41;
        local_1c0 = 0;
        local_1b8 = 0;
        local_1b0 = 0;
        ge_00 = (secp256k1_ge *)local_198;
        ctx = CTX;
        local_1d0 = (secp256k1_ge *)local_198;
        iVar9 = secp256k1_ec_pubkey_serialize
                          (CTX,(uchar *)local_198,&local_1a8,(secp256k1_pubkey *)local_128,2);
        if (iVar9 == 0) goto LAB_001581d8;
        local_1d8 = 0x4d430005;
        local_1c8 = local_1a8;
        local_1c0 = 0;
        local_1b8 = 0;
        local_1b0 = 0;
        uVar1 = (ulong)((long)ctx << 3) >> 0x33;
        uVar2 = (((long)ctx << 3 | (ulong)ctx >> 0x3d) << 0xd | uVar1) >> 3;
        ctx = (secp256k1_context *)(uVar2 << 0x33 | (uVar1 << 0x3d | uVar2) >> 0xd);
        local_1d0 = (secp256k1_ge *)local_198;
        if (local_1a8 == 0x41) {
          if (local_198[0] != '\x04') goto LAB_001581e2;
          lVar10 = 0;
          do {
            if (local_198[lVar10 + 1] != input[lVar10]) goto LAB_001581ec;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x40);
          goto LAB_00158179;
        }
        goto LAB_001581dd;
      }
LAB_00158179:
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x100);
    local_198._80_8_ = local_198._80_8_ + 1;
    if (local_198._80_8_ == 0x42) {
      return;
    }
  } while( true );
}

Assistant:

static void ec_pubkey_parse_pointtest(const unsigned char *input, int xvalid, int yvalid) {
    unsigned char pubkeyc[65];
    secp256k1_pubkey pubkey;
    secp256k1_ge ge;
    size_t pubkeyclen;

    for (pubkeyclen = 3; pubkeyclen <= 65; pubkeyclen++) {
        /* Smaller sizes are tested exhaustively elsewhere. */
        int32_t i;
        memcpy(&pubkeyc[1], input, 64);
        SECP256K1_CHECKMEM_UNDEFINE(&pubkeyc[pubkeyclen], 65 - pubkeyclen);
        for (i = 0; i < 256; i++) {
            /* Try all type bytes. */
            int xpass;
            int ypass;
            int ysign;
            pubkeyc[0] = i;
            /* What sign does this point have? */
            ysign = (input[63] & 1) + 2;
            /* For the current type (i) do we expect parsing to work? Handled all of compressed/uncompressed/hybrid. */
            xpass = xvalid && (pubkeyclen == 33) && ((i & 254) == 2);
            /* Do we expect a parse and re-serialize as uncompressed to give a matching y? */
            ypass = xvalid && yvalid && ((i & 4) == ((pubkeyclen == 65) << 2)) &&
                ((i == 4) || ((i & 251) == ysign)) && ((pubkeyclen == 33) || (pubkeyclen == 65));
            if (xpass || ypass) {
                /* These cases must parse. */
                unsigned char pubkeyo[65];
                size_t outl;
                memset(&pubkey, 0, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                outl = 65;
                SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
                SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                CHECK(outl == 33);
                CHECK(secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0);
                CHECK((pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0]));
                if (ypass) {
                    /* This test isn't always done because we decode with alternative signs, so the y won't match. */
                    CHECK(pubkeyo[0] == ysign);
                    CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1);
                    memset(&pubkey, 0, sizeof(pubkey));
                    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                    secp256k1_pubkey_save(&pubkey, &ge);
                    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                    outl = 65;
                    SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1);
                    SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                    CHECK(outl == 65);
                    CHECK(pubkeyo[0] == 4);
                    CHECK(secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0);
                }
            } else {
                /* These cases must fail to parse. */
                memset(&pubkey, 0xfe, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                CHECK_ILLEGAL(CTX, secp256k1_pubkey_load(CTX, &ge, &pubkey));
            }
        }
    }
}